

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::custom_notification_msg::serialize(custom_notification_msg *this)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  buffer_serializer *in_RDI;
  ptr<buffer> pVar4;
  buffer_serializer bs;
  size_t len;
  uint8_t CURRENT_VERSION;
  ptr<buffer> *ret;
  size_t in_stack_000000c8;
  undefined8 in_stack_ffffffffffffff80;
  endianness endian;
  ptr<buffer> *in_stack_ffffffffffffff88;
  buffer_serializer *this_00;
  buffer_serializer *this_01;
  
  endian = (endianness)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this_01 = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 8));
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18b5bd);
    this_00 = (buffer_serializer *)buffer::size(peVar2);
  }
  else {
    this_00 = (buffer_serializer *)0x0;
  }
  buffer::alloc(in_stack_000000c8);
  buffer_serializer::buffer_serializer(this_00,in_stack_ffffffffffffff88,endian);
  buffer_serializer::put_u8(this_01,(uint8_t)((ulong)in_RDI >> 0x38));
  buffer_serializer::put_u8(this_01,(uint8_t)((ulong)in_RDI >> 0x38));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 8));
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18b64e);
    buffer::data_begin(peVar2);
    peVar2 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18b66b);
    buffer::size(peVar2);
    buffer_serializer::put_bytes(this_01,in_RDI,(size_t)this_00);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    buffer_serializer::put_u32(this_01,(uint32_t)((ulong)in_RDI >> 0x20));
    _Var3._M_pi = extraout_RDX_00;
  }
  pVar4.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_01;
  return (ptr<buffer>)pVar4.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> custom_notification_msg::serialize() const {
    //   << Format >>
    // version          1 byte
    // type             1 byte
    // ctx length (X)   4 bytes
    // ctx              X bytes

    const uint8_t CURRENT_VERSION = 0x0;

    size_t len = sizeof(uint8_t) +
                 sizeof(uint8_t) +
                 sizeof(uint32_t) +
                 ( (ctx_) ? ctx_->size() : 0 );

    ptr<buffer> ret = buffer::alloc(len);
    buffer_serializer bs(ret);
    bs.put_u8(CURRENT_VERSION);
    bs.put_u8(type_);
    if (ctx_) {
        bs.put_bytes(ctx_->data_begin(), ctx_->size());
    } else {
        bs.put_u32(0);
    }

    return ret;
}